

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_685c1::IntrusiveListIteratorTest::
TestBackward<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          (IntrusiveListIteratorTest *this,const_iterator first,const_iterator last,
          vector<int,_std::allocator<int>_> *expected)

{
  unsigned_long uVar1;
  int line;
  GTestFlagSaver *pGVar2;
  unsigned_long uVar3;
  long lVar4;
  TestObject *pTVar5;
  char *message;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  unsigned_long local_40;
  AssertHelper local_38;
  
  pTVar5 = last.node_;
  pGVar2 = (GTestFlagSaver *)last.list_;
  local_40 = 0;
  if ((GTestFlagSaver *)this != (GTestFlagSaver *)first.node_) {
    __assert_fail("list_ == rhs.list_",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                  ,0x101,
                  "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator!=(const_iterator) const [T = (anonymous namespace)::TestObject]"
                 );
  }
  if (pGVar2 != (GTestFlagSaver *)first.list_) {
    lVar4 = 0;
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (pGVar2 == (GTestFlagSaver *)0x0) {
        pGVar2 = (GTestFlagSaver *)first.node_;
      }
      pGVar2 = (((__uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                  *)&(pGVar2->color_)._M_dataplus._M_p)->_M_t).
               super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
               .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl;
      if (pGVar2 == (GTestFlagSaver *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/intrusive-list.h"
                      ,0xe0,
                      "pointer wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator->() const [T = (anonymous namespace)::TestObject]"
                     );
      }
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"expected[count]","last->data",
                 (int *)((long)&(((pTVar5->
                                  super_intrusive_list_base<(anonymous_namespace)::TestObject>).
                                 next_)->
                                super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_
                        + lVar4),(int *)&(pGVar2->color_)._M_string_length);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_50->_M_dataplus)._M_p;
        }
        line = 0xad;
        goto LAB_00149afd;
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      lVar4 = lVar4 + 4;
      uVar1 = uVar3 + 1;
      local_40 = uVar3;
    } while (pGVar2 != (GTestFlagSaver *)first.list_);
  }
  local_48._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)(pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ -
        (long)(pTVar5->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ >> 2);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            (local_58,"count","expected.size()",&local_40,(unsigned_long *)&local_48);
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_48);
    if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_50->_M_dataplus)._M_p;
    }
    line = 0xb0;
LAB_00149afd:
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/test-intrusive-list.cc"
               ,line,message);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
  return;
}

Assistant:

void TestBackward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      --last;
      ASSERT_EQ(expected[count], last->data);
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }